

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

int Bmc_CollapseIrredundantFull(Vec_Str_t *vSop,int nCubes,int nVars)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  sat_solver *s;
  void *pvVar2;
  void *pvVar3;
  int *piVar4;
  int *piVar5;
  int local_5c;
  int j;
  Vec_Ptr_t *vCubes;
  char *pSop;
  char *pCube;
  Vec_Int_t *vLits;
  int nRemoved;
  int status;
  int k;
  int i;
  sat_solver *pSat;
  int nBTLimit;
  int nVars_local;
  int nCubes_local;
  Vec_Str_t *vSop_local;
  
  vLits._0_4_ = 0;
  p = Vec_IntAlloc(nVars + nCubes);
  pSop = Vec_StrArray(vSop);
  p_00 = Vec_PtrAlloc(nCubes);
  iVar1 = Vec_StrSize(vSop);
  if (iVar1 != nCubes * (nVars + 3) + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x11c,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
  }
  for (; *pSop != '\0'; pSop = pSop + (nVars + 3)) {
    Vec_PtrPush(p_00,pSop);
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,nVars + nCubes);
  for (status = 0; iVar1 = Vec_PtrSize(p_00), status < iVar1; status = status + 1) {
    pvVar2 = Vec_PtrEntry(p_00,status);
    iVar1 = Abc_Var2Lit(nVars + status,1);
    Vec_IntFill(p,1,iVar1);
    for (nRemoved = 0; nRemoved < nVars; nRemoved = nRemoved + 1) {
      if (*(char *)((long)pvVar2 + (long)nRemoved) != '-') {
        iVar1 = Abc_Var2Lit(nRemoved,(uint)(*(char *)((long)pvVar2 + (long)nRemoved) == '0'));
        Vec_IntPush(p,iVar1);
      }
    }
    piVar4 = Vec_IntArray(p);
    piVar5 = Vec_IntLimit(p);
    iVar1 = sat_solver_addclause(s,piVar4,piVar5);
    if (iVar1 != 1) {
      __assert_fail("status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,300,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
    }
  }
  for (status = 0; iVar1 = Vec_PtrSize(p_00), status < iVar1; status = status + 1) {
    pvVar2 = Vec_PtrEntry(p_00,status);
    Vec_IntClear(p);
    for (nRemoved = 0; nRemoved < nCubes; nRemoved = nRemoved + 1) {
      if ((nRemoved != status) && (pvVar3 = Vec_PtrEntry(p_00,nRemoved), pvVar3 != (void *)0x0)) {
        iVar1 = Abc_Var2Lit(nVars + nRemoved,0);
        Vec_IntPush(p,iVar1);
      }
    }
    for (nRemoved = 0; nRemoved < nVars; nRemoved = nRemoved + 1) {
      if (*(char *)((long)pvVar2 + (long)nRemoved) != '-') {
        iVar1 = Abc_Var2Lit(nRemoved,(uint)(*(char *)((long)pvVar2 + (long)nRemoved) == '1'));
        Vec_IntPush(p,iVar1);
      }
    }
    piVar4 = Vec_IntArray(p);
    piVar5 = Vec_IntLimit(p);
    iVar1 = sat_solver_solve(s,piVar4,piVar5,0,0,0,0);
    if (iVar1 == 0) break;
    if (iVar1 == -1) {
      Vec_PtrWriteEntry(p_00,status,(void *)0x0);
      vLits._0_4_ = (int)vLits + 1;
    }
    else if (iVar1 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x145,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
    }
  }
  iVar1 = Vec_PtrSize(p_00);
  if ((status == iVar1) && (0 < (int)vLits)) {
    local_5c = 0;
    for (status = 0; iVar1 = Vec_PtrSize(p_00), status < iVar1; status = status + 1) {
      pvVar2 = Vec_PtrEntry(p_00,status);
      if (pvVar2 != (void *)0x0) {
        for (nRemoved = 0; nRemoved < nVars + 3; nRemoved = nRemoved + 1) {
          Vec_StrWriteEntry(vSop,local_5c,*(char *)((long)pvVar2 + (long)nRemoved));
          local_5c = local_5c + 1;
        }
      }
    }
    Vec_StrWriteEntry(vSop,local_5c,'\0');
    Vec_StrShrink(vSop,local_5c + 1);
  }
  sat_solver_delete(s);
  Vec_PtrFree(p_00);
  Vec_IntFree(p);
  return (uint)(status == -1);
}

Assistant:

int Bmc_CollapseIrredundantFull( Vec_Str_t * vSop, int nCubes, int nVars )
{
    int nBTLimit = 0;
    sat_solver * pSat; 
    int i, k, status, nRemoved = 0; 
    Vec_Int_t * vLits = Vec_IntAlloc(nVars+nCubes);
    // collect cubes
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Ptr_t * vCubes = Vec_PtrAlloc(nCubes);
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars + nCubes );
    // add cubes
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntFill( vLits, 1, Abc_Var2Lit(nVars + i, 1) ); // neg literal
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '0') );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // iterate through cubes in the direct order
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < nCubes; k++ )
            if ( k != i && Vec_PtrEntry(vCubes, k) ) // skip this cube and already removed cubes
                Vec_IntPush( vLits, Abc_Var2Lit(nVars + k, 0) ); // pos literal
        // collect cube
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '1') );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat
        {
            Vec_PtrWriteEntry( vCubes, i, NULL );
            nRemoved++;
            continue;
        }
        assert( status == l_True );
    }
    //printf( "Approximate irrendundant reduced %d cubes (out of %d).\n", nRemoved, nCubes );
    // cleanup cover
    if ( i == Vec_PtrSize(vCubes) && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        int j = 0;
        Vec_PtrForEachEntry( char *, vCubes, pCube, i )
            if ( pCube != NULL )
                for ( k = 0; k < nVars + 3; k++ )
                    Vec_StrWriteEntry( vSop, j++, pCube[k] );
        Vec_StrWriteEntry( vSop, j++, '\0' );
        Vec_StrShrink( vSop, j );
    }
    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
    Vec_IntFree( vLits );
    return i == -1 ? 1 : 0;
}